

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O2

void __thiscall
chrono::ChLoad<chrono::ChLoaderGravity>::CreateJacobianMatrices
          (ChLoad<chrono::ChLoaderGravity> *this)

{
  ChLoadJacobians *pCVar1;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> mvars;
  long *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  _Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_48;
  _Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_30;
  
  if ((this->super_ChLoadBase).jacobians == (ChLoadJacobians *)0x0) {
    pCVar1 = (ChLoadJacobians *)::operator_new(0x80);
    (pCVar1->KRM).super_ChKblock._vptr_ChKblock = (_func_int **)&PTR__ChKblockGeneric_01186748;
    (pCVar1->KRM).K.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
    m_data = (double *)0x0;
    (pCVar1->KRM).K.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
    m_rows = 0;
    (pCVar1->KRM).K.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
    m_cols = 0;
    (pCVar1->KRM).variables.
    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pCVar1->KRM).variables.
    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pCVar1->KRM).variables.
    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pCVar1->K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    (pCVar1->K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
         0;
    (pCVar1->K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
         0;
    (pCVar1->K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
         0;
    (pCVar1->R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    (pCVar1->R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
         0;
    (pCVar1->R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
         0;
    (pCVar1->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    (pCVar1->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
         0;
    (pCVar1->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
         0;
    (this->super_ChLoadBase).jacobians = pCVar1;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._0_16_ = ZEXT416(0) << 0x40;
    std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChLoadableUVW,void>
              ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_58,
               &(this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
                super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>);
    (**(code **)(*local_58 + 0x60))(local_58,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
    pCVar1 = (this->super_ChLoadBase).jacobians;
    std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
              ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_30,
               (vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_48);
    ChLoadJacobians::SetVariables
              (pCVar1,(vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)
                      &local_30);
    std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
              (&local_30);
    std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
              (&local_48);
  }
  return;
}

Assistant:

inline void ChLoad<Tloader>::CreateJacobianMatrices() {
    if (!this->jacobians) {
        // create jacobian structure
        this->jacobians = new ChLoadJacobians;
        // set variables forsparse KRM block
        std::vector<ChVariables*> mvars;
        loader.GetLoadable()->LoadableGetVariables(mvars);
        this->jacobians->SetVariables(mvars);
    }
}